

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O2

vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
* __thiscall
sfc::Palette::colors
          (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           *__return_storage_ptr__,Palette *this)

{
  pointer pSVar1;
  pointer pSVar2;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> _Stack_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar1 = (this->_subpalettes).
           super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar2 = (this->_subpalettes).
                super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar2 != pSVar1; pSVar2 = pSVar2 + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_38,&pSVar2->_colors);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&_Stack_38);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&_Stack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<rgba_vec_t> Palette::colors() const {
  std::vector<rgba_vec_t> v;
  for (const auto& sp : _subpalettes)
    v.push_back(sp.colors());
  return v;
}